

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ba_sparse_matrix.h
# Opt level: O2

void __thiscall
sfm::ba::SparseMatrix<double>::set_from_triplets(SparseMatrix<double> *this,Triplets *triplets)

{
  double dVar1;
  unsigned_long uVar2;
  long lVar3;
  pointer pTVar4;
  double *pdVar5;
  double dVar6;
  ulong uVar7;
  bool bVar8;
  SparseMatrix<double> local_e8;
  undefined1 local_90 [8];
  SparseMatrix<double> transposed;
  vector<unsigned_long,_std::allocator<unsigned_long>_> scratch;
  
  SparseMatrix((SparseMatrix<double> *)local_90,this->cols,this->rows);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&transposed.cols,
             ((long)(triplets->
                    super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(triplets->
                   super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &transposed.outer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             ((long)(triplets->
                    super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(triplets->
                   super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pTVar4 = (triplets->
           super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = ((long)(triplets->
                 super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x18;
  while (bVar8 = lVar3 != 0, lVar3 = lVar3 + -1, bVar8) {
    transposed.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[pTVar4->row] =
         (double)((long)transposed.values.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[pTVar4->row] + 1);
    pTVar4 = pTVar4 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &transposed.inner.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (long)transposed.outer.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start -
             (long)transposed.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage >> 3,(allocator_type *)&local_e8);
  dVar6 = 0.0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)transposed.outer.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                      (long)transposed.values.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
      uVar7 = uVar7 + 1) {
    dVar1 = transposed.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[uVar7];
    transposed.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[uVar7] = dVar6;
    transposed.inner.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[uVar7] = (unsigned_long)dVar6;
    dVar6 = (double)((long)dVar1 + (long)dVar6);
  }
  pTVar4 = (triplets->
           super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = ((long)(triplets->
                 super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0x18;
  pdVar5 = &pTVar4->value;
  while (bVar8 = lVar3 != 0, lVar3 = lVar3 + -1, bVar8) {
    uVar2 = transposed.inner.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[((Triplet *)(pdVar5 + -2))->row];
    transposed.inner.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[((Triplet *)(pdVar5 + -2))->row] = uVar2 + 1;
    *(double *)(transposed.cols + uVar2 * 8) = *pdVar5;
    transposed.outer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[uVar2] = (unsigned_long)pdVar5[-1];
    pdVar5 = pdVar5 + 3;
  }
  transpose(&local_e8,(SparseMatrix<double> *)local_90);
  operator=(this,&local_e8);
  ~SparseMatrix(&local_e8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &transposed.inner.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ~SparseMatrix((SparseMatrix<double> *)local_90);
  return;
}

Assistant:

void
SparseMatrix<T>::set_from_triplets (Triplets const& triplets)
{
    /* Create a temporary transposed matrix */
    SparseMatrix<T> transposed(this->cols, this->rows);
    transposed.values.resize(triplets.size());
    transposed.inner.resize(triplets.size());

    // 统计每一行 Non-zero elements 的个数
    /* Initialize outer indices with amount of inner values. */
    for (std::size_t i = 0; i < triplets.size(); ++i)
        transposed.outer[triplets[i].row]++;

    /* Convert amounts to indices with prefix sum. */
    std::size_t sum = 0;
    std::vector<std::size_t> scratch(transposed.outer.size());
    for (std::size_t i = 0; i < transposed.outer.size(); ++i)
    {
        std::size_t const temp = transposed.outer[i];
        transposed.outer[i] = sum;
        scratch[i] = sum;
        sum += temp;
    }

    /* Add triplets, inner indices are unsorted. */
    for (std::size_t i = 0; i < triplets.size(); ++i)
    {
        Triplet const& t = triplets[i];
        std::size_t pos = scratch[t.row]++;
        transposed.values[pos] = t.value;
        transposed.inner[pos] = t.col;
    }

    /* Transpose matrix, implicit sorting of inner indices. */
    *this = transposed.transpose();
}